

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_test.cpp
# Opt level: O3

void system_test::comparisonTest(void)

{
  SystemImpl *this;
  SystemImpl *this_00;
  
  this = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this);
  this_00 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_00);
  if (this != this_00) {
    return;
  }
  __assert_fail("sys1 != sys2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/unit_tests/system_test.cpp"
                ,0x1e,"static void system_test::comparisonTest()");
}

Assistant:

void system_test::comparisonTest() {
    auto *sys1 = new SystemImpl();
    auto *sys2 = new SystemImpl();
    assert(sys1 != sys2);

}